

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_swap(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 arg1;
  TCGv_i32 ret;
  TCGv_i32 ret_00;
  uintptr_t o;
  uintptr_t o_1;
  
  tcg_ctx = s->uc->tcg_ctx;
  ret = tcg_temp_new_i32(tcg_ctx);
  ret_00 = tcg_temp_new_i32(tcg_ctx);
  arg1 = tcg_ctx->cpu_dregs[insn & 7];
  tcg_gen_shli_i32_m68k(tcg_ctx,ret,arg1,0x10);
  tcg_gen_shri_i32_m68k(tcg_ctx,ret_00,arg1,0x10);
  tcg_gen_or_i32(tcg_ctx,arg1,ret,ret_00);
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  gen_logic_cc(s,arg1,2);
  return;
}

Assistant:

DISAS_INSN(swap)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src1;
    TCGv src2;
    TCGv reg;

    src1 = tcg_temp_new(tcg_ctx);
    src2 = tcg_temp_new(tcg_ctx);
    reg = DREG(insn, 0);
    tcg_gen_shli_i32(tcg_ctx, src1, reg, 16);
    tcg_gen_shri_i32(tcg_ctx, src2, reg, 16);
    tcg_gen_or_i32(tcg_ctx, reg, src1, src2);
    tcg_temp_free(tcg_ctx, src2);
    tcg_temp_free(tcg_ctx, src1);
    gen_logic_cc(s, reg, OS_LONG);
}